

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_prepro.cpp
# Opt level: O2

void __thiscall DFsScript::ClearSections(DFsScript *this)

{
  DFsSection *pDVar1;
  DFsSection *pDVar2;
  int i;
  long lVar3;
  
  for (lVar3 = 0; lVar3 != 0x11; lVar3 = lVar3 + 1) {
    pDVar1 = GC::ReadBarrier<DFsSection>((DFsSection **)&this->sections[lVar3].field_0);
    while (pDVar1 != (DFsSection *)0x0) {
      pDVar2 = GC::ReadBarrier<DFsSection>((DFsSection **)&pDVar1->next);
      (*(pDVar1->super_DObject)._vptr_DObject[4])(pDVar1);
      pDVar1 = pDVar2;
    }
    this->sections[lVar3].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1)0x0;
  }
  return;
}

Assistant:

void DFsScript::ClearSections()
{
	for(int i=0;i<SECTIONSLOTS;i++)
	{
		DFsSection * var = sections[i];
		while(var)
		{
			DFsSection *next = var->next;
			var->Destroy();
			var = next;
		}
		sections[i] = NULL;
	}
}